

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.h
# Opt level: O0

void __thiscall
RegVmLoweredInstruction::RegVmLoweredInstruction
          (RegVmLoweredInstruction *this,Allocator *allocator,SynBase *location,
          RegVmInstructionCode code,uchar rA,uchar rB,uchar rC,VmConstant *argument)

{
  uchar rB_local;
  uchar rA_local;
  RegVmInstructionCode code_local;
  SynBase *location_local;
  Allocator *allocator_local;
  RegVmLoweredInstruction *this_local;
  
  this->location = location;
  this->code = code;
  this->rA = rA;
  this->rB = rB;
  this->rC = rC;
  this->argument = argument;
  SmallArray<unsigned_char,_8U>::SmallArray(&this->preKillRegisters,allocator);
  SmallArray<unsigned_char,_8U>::SmallArray(&this->postKillRegisters,allocator);
  this->parent = (RegVmLoweredBlock *)0x0;
  this->prevSibling = (RegVmLoweredInstruction *)0x0;
  this->nextSibling = (RegVmLoweredInstruction *)0x0;
  return;
}

Assistant:

RegVmLoweredInstruction(Allocator *allocator, SynBase *location, RegVmInstructionCode code, unsigned char rA, unsigned char rB, unsigned char rC, VmConstant *argument): location(location), code(code), rA(rA), rB(rB), rC(rC), argument(argument), preKillRegisters(allocator), postKillRegisters(allocator)
	{
		parent = NULL;

		prevSibling = NULL;
		nextSibling = NULL;
	}